

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example008_miller_rabin_prime.cpp
# Opt level: O3

bool math::wide_integer::example008_miller_rabin_prime(void)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  
  bVar2 = 1;
  iVar3 = 8;
  do {
    bVar1 = local_example008_miller_rabin_prime::example008_miller_rabin_prime_run();
    bVar2 = bVar2 & bVar1;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  bVar1 = local_example008_miller_rabin_prime::example008_miller_rabin_prime_check_known_primes();
  return (bool)(bVar1 & bVar2);
}

Assistant:

auto ::math::wide_integer::example008_miller_rabin_prime() -> bool
#endif
{
  auto result_is_ok = true;

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
  #if !defined(UINTWIDE_T_REDUCE_TEST_DEPTH)
             i < static_cast<unsigned>(UINT8_C(8));
  #else
             i < static_cast<unsigned>(UINT8_C(1));
  #endif
           ++i)
  {
    const auto result_prime_run_is_ok =
      local_example008_miller_rabin_prime::example008_miller_rabin_prime_run();
  
    result_is_ok = (result_prime_run_is_ok && result_is_ok);
  }

  {
    const auto result_known_primes_is_ok =
      local_example008_miller_rabin_prime::example008_miller_rabin_prime_check_known_primes();

    result_is_ok = (result_known_primes_is_ok && result_is_ok);
  }

  return result_is_ok;
}